

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
libcellml::Units::addUnit
          (Units *this,StandardUnit standardUnit,int prefix,double exponent,double multiplier,
          string *id)

{
  mapped_type *reference;
  int value;
  StandardUnit local_4c;
  string local_48;
  
  local_4c = standardUnit;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&local_4c);
  convertToString_abi_cxx11_(&local_48,(libcellml *)(ulong)(uint)prefix,value);
  addUnit(this,reference,&local_48,exponent,multiplier,id);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit, int prefix, double exponent,
                    double multiplier, const std::string &id)
{
    addUnit(standardUnitToString.at(standardUnit), convertToString(prefix), exponent, multiplier, id);
}